

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::UpdateChunkName(Segment *this,char *ext,char **name)

{
  size_t __n;
  size_t __n_00;
  void *__dest;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  char *str;
  size_t length;
  size_t ext_chk_length;
  size_t chunking_base_name_length;
  char ext_chk [64];
  char local_68 [72];
  undefined8 *local_20;
  bool local_1;
  
  if ((in_RDX == (undefined8 *)0x0) || (in_RSI == 0)) {
    local_1 = false;
  }
  else {
    local_20 = in_RDX;
    snprintf(local_68,0x40,"_%06d.%s",(ulong)*(uint *)(in_RDI + 200),in_RSI);
    __n = strlen(*(char **)(in_RDI + 0xf8));
    __n_00 = strlen(local_68);
    __dest = operator_new__(__n + __n_00 + 1,(nothrow_t *)&std::nothrow);
    if (__dest == (void *)0x0) {
      local_1 = false;
    }
    else {
      memcpy(__dest,*(void **)(in_RDI + 0xf8),__n);
      memcpy((void *)((long)__dest + __n),local_68,__n_00);
      *(undefined1 *)((long)__dest + __n + __n_00) = 0;
      if ((void *)*local_20 != (void *)0x0) {
        operator_delete__((void *)*local_20);
      }
      *local_20 = __dest;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Segment::UpdateChunkName(const char* ext, char** name) const {
  if (!name || !ext)
    return false;

  char ext_chk[64];
#ifdef _MSC_VER
  sprintf_s(ext_chk, sizeof(ext_chk), "_%06d.%s", chunk_count_, ext);
#else
  snprintf(ext_chk, sizeof(ext_chk), "_%06d.%s", chunk_count_, ext);
#endif

  const size_t chunking_base_name_length = strlen(chunking_base_name_);
  const size_t ext_chk_length = strlen(ext_chk);
  const size_t length = chunking_base_name_length + ext_chk_length + 1;
  char* const str = new (std::nothrow) char[length];  // NOLINT
  if (!str)
    return false;

  memcpy(str, chunking_base_name_, chunking_base_name_length);
  memcpy(&str[chunking_base_name_length], ext_chk, ext_chk_length);
  str[chunking_base_name_length + ext_chk_length] = '\0';

  delete[] * name;
  *name = str;

  return true;
}